

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void nuts_tran_conn_refused(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  char *pcVar4;
  char *pcVar5;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *addr;
  nng_dialer d;
  nng_socket s;
  char *scheme_local;
  
  _d = scheme;
  memset((void *)((long)&addr + 4),0,4);
  memset(&addr,0,4);
  pcVar4 = strchr(_d,0x36);
  if ((pcVar4 == (char *)0x0) || (_Var1 = nuts_has_ipv6(), _Var1)) {
    nuts_scratch_addr(_d,0x40,nuts_tran_conn_refused::nuts_addr_);
    nVar2 = nng_pair1_open((nng_socket *)((long)&addr + 4));
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0xf7,"%s: expected success, got %s (%d)","nng_pair1_open(&(s))",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    num = nng_dial(addr._4_4_,nuts_tran_conn_refused::nuts_addr_,(nng_dialer *)&addr,0);
    pcVar4 = nng_strerror(NNG_ECONNREFUSED);
    acutest_check_((uint)(num == NNG_ECONNREFUSED),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0xf8,"%s fails with %s","nng_dial(s, addr, &d, 0)",pcVar4,nVar2);
    pcVar4 = nng_strerror(NNG_ECONNREFUSED);
    pcVar5 = nng_strerror(num);
    acutest_message_("%s: expected %s (%d), got %s (%d)","nng_dial(s, addr, &d, 0)",pcVar4,6,pcVar5,
                     (ulong)num);
    iVar3 = nng_dialer_id(addr._0_4_);
    acutest_check_((uint)(iVar3 < 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0xf9,"%s","nng_dialer_id(d) < 0");
    nVar2 = nng_socket_close(addr._4_4_);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0xfa,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
  }
  else {
    acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                  ,0xf5,"No IPv6 support present");
  }
  return;
}

Assistant:

void
nuts_tran_conn_refused(const char *scheme)
{
	nng_socket  s = NNG_SOCKET_INITIALIZER;
	nng_dialer  d = NNG_DIALER_INITIALIZER;
	const char *addr;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR(addr, scheme);
	NUTS_OPEN(s);
	NUTS_FAIL(nng_dial(s, addr, &d, 0), NNG_ECONNREFUSED);
	NUTS_TRUE(nng_dialer_id(d) < 0);
	NUTS_CLOSE(s);
}